

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm_manager.cc
# Opt level: O2

RC __thiscall SM_Manager::Help(SM_Manager *this,char *relName)

{
  RC RVar1;
  RC RVar2;
  int extraout_EAX;
  int extraout_EAX_00;
  ostream *poVar3;
  DataAttrInfo *attributes;
  RC RVar4;
  SM_Manager *this_00;
  RC RVar5;
  bool bVar6;
  IX_IndexHandle ih;
  char *pData;
  DataAttrInfo *local_d8;
  RM_Record rec;
  Printer printer;
  RM_FileScan fs;
  
  poVar3 = std::operator<<((ostream *)&std::cout,"Help\n");
  poVar3 = std::operator<<(poVar3,"   relName=");
  poVar3 = std::operator<<(poVar3,relName);
  std::operator<<(poVar3,"\n");
  RM_FileScan::RM_FileScan(&fs);
  RM_Record::RM_Record(&rec);
  RVar1 = RM_FileScan::OpenScan(&fs,&this->relcatFH,STRING,0x19,0,EQ_OP,relName,NO_HINT);
  if (RVar1 == 0) {
    RVar1 = RM_FileScan::GetNextRec(&fs,&rec);
    if (RVar1 == 0x6e) {
      RVar1 = 0x12e;
      RM_FileScan::CloseScan(&fs);
    }
    else {
      RM_FileScan::CloseScan(&fs);
      this_00 = (SM_Manager *)0x198;
      attributes = (DataAttrInfo *)malloc(0x198);
      SetUpAttrCatAttributes(this_00,attributes);
      local_d8 = attributes;
      Printer::Printer(&printer,attributes,6);
      Printer::PrintHeader(&printer,(ostream *)&std::cout);
      RVar1 = RM_FileScan::OpenScan(&fs,&this->attrcatFH,STRING,0x19,0,EQ_OP,relName,NO_HINT);
      if (RVar1 == 0) {
        while (RVar1 = RM_FileScan::GetNextRec(&fs,&rec), RVar1 != 0x6e) {
          RVar1 = RM_Record::GetData(&rec,&pData);
          if (RVar1 != 0) goto LAB_00109efc;
          Printer::Print(&printer,(ostream *)&std::cout,pData);
        }
        RVar1 = RM_FileScan::CloseScan(&fs);
        if ((RVar1 == 0) &&
           (RVar1 = RM_FileScan::OpenScan(&fs,&this->attrcatFH,STRING,0x19,0,EQ_OP,relName,NO_HINT),
           RVar1 == 0)) {
          RVar5 = 0;
          RVar4 = RVar1;
LAB_00109e24:
          do {
            RVar1 = RM_FileScan::GetNextRec(&fs,&rec);
            if (RVar1 == 0x6e) {
              Printer::PrintFooter(&printer,(ostream *)&std::cout);
              free(local_d8);
LAB_00109efc:
              RVar1 = 0;
              break;
            }
            RVar2 = RM_Record::GetData(&rec,&pData);
            RVar1 = RVar5;
            if (RVar2 != 0) break;
            if ((this->printIndex == true) && (*(int *)(pData + 0x40) != -1)) goto LAB_00109e6f;
          } while( true );
        }
      }
LAB_00109efe:
      Printer::~Printer(&printer);
    }
  }
  RM_Record::~RM_Record(&rec);
  RM_FileScan::~RM_FileScan(&fs);
  return RVar1;
LAB_00109e6f:
  IX_Manager::DestroyIndex((IX_Manager *)&ih);
  IX_Manager::DestroyIndex(this->ixm);
  if (extraout_EAX == 0) {
    IX_Manager::DestroyIndex(this->ixm);
    bVar6 = extraout_EAX_00 == 0;
    RVar1 = RVar4;
    RVar5 = extraout_EAX_00;
    if (!bVar6) {
      RVar1 = extraout_EAX_00;
    }
  }
  else {
    bVar6 = false;
    RVar1 = extraout_EAX;
    RVar5 = extraout_EAX;
  }
  IX_IndexHandle::~IX_IndexHandle(&ih);
  RVar4 = RVar1;
  if (!bVar6) goto LAB_00109efe;
  goto LAB_00109e24;
}

Assistant:

RC SM_Manager::Help(const char *relName)
{
    cout << "Help\n"
         << "   relName=" << relName << "\n";
  RC rc = 0;
  RM_FileScan fs;
  RM_Record rec;

  // Check that this relation exists:
  if((rc = fs.OpenScan(relcatFH, STRING, MAXNAME+1, 0, EQ_OP, const_cast<char*>(relName))))
    return (rc);
  if(fs.GetNextRec(rec) == RM_EOF){
    fs.CloseScan();
    return (SM_BADRELNAME);
  }
  fs.CloseScan();
  

  // Sets up the DataAttrInfo for printing
  DataAttrInfo * attributes = (DataAttrInfo *)malloc(6* sizeof(DataAttrInfo));
  if((rc = SetUpAttrCatAttributes(attributes)))
    return (rc);
  Printer printer(attributes, 6);
  printer.PrintHeader(cout);

  // Iterate through attrcat to find all attributes
  // associated with this relation. And print them.
  if((rc = fs.OpenScan(attrcatFH, STRING, MAXNAME+1, 0, EQ_OP, const_cast<char*>(relName))))
    return (rc);

  while(fs.GetNextRec(rec) != RM_EOF){
    char *pData;
    if((rec.GetData(pData)))
      return (rc);
    printer.Print(cout, pData);
  }

  if((rc = fs.CloseScan() ))
    return (rc);

  // If we are to print the index, itereate through again, and print
  // the entire index
  if((rc = fs.OpenScan(attrcatFH, STRING, MAXNAME+1, 0, EQ_OP, const_cast<char*>(relName))))
    return (rc);
  while(fs.GetNextRec(rec) != RM_EOF){
    char *pData;
    if((rec.GetData(pData)))
      return (rc);
    if(printIndex){
    AttrCatEntry *attr = (AttrCatEntry*)pData;
      if((attr->indexNo != NO_INDEXES)){
        IX_IndexHandle ih;
        if((rc = ixm.OpenIndex(relName, attr->indexNo, ih)))
          return (rc);
        if((rc = ixm.CloseIndex(ih)))
          return (rc);
      }
    }
  }

  printer.PrintFooter(cout);
  free(attributes);
  return (0);
}